

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx::ArrayIntersectorK_1<8,_embree::avx::ObjectIntersectorK<8,_false>_>,_false>
     ::intersect(vint<8> *valid_i,Intersectors *This,RayHitK<8> *ray,RayQueryContext *context)

{
  undefined1 (*pauVar1) [32];
  uint uVar2;
  undefined1 auVar3 [32];
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  byte bVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  size_t bits;
  ulong uVar37;
  ulong uVar38;
  _func_int **pp_Var39;
  undefined4 uVar40;
  long lVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  NodeRef nodeRef;
  ulong uVar45;
  ulong *puVar46;
  undefined1 (*pauVar47) [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [64];
  undefined1 auVar59 [16];
  undefined1 auVar58 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [64];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  vint<8> mask;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  undefined1 local_2800 [16];
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [16];
  RTCIntersectFunctionNArguments local_2788;
  Geometry *local_2758;
  undefined8 local_2750;
  RTCIntersectArguments *local_2748;
  undefined1 local_2740 [16];
  undefined1 local_2730 [16];
  undefined1 local_2720 [32];
  float local_2700;
  float fStack_26fc;
  float fStack_26f8;
  float fStack_26f4;
  float fStack_26f0;
  float fStack_26ec;
  float fStack_26e8;
  float fStack_26e4;
  float local_26e0;
  float fStack_26dc;
  float fStack_26d8;
  float fStack_26d4;
  float fStack_26d0;
  float fStack_26cc;
  float fStack_26c8;
  float fStack_26c4;
  float local_26c0;
  float fStack_26bc;
  float fStack_26b8;
  float fStack_26b4;
  float fStack_26b0;
  float fStack_26ac;
  float fStack_26a8;
  float fStack_26a4;
  undefined8 local_26a0;
  undefined8 uStack_2698;
  undefined8 uStack_2690;
  undefined8 uStack_2688;
  undefined4 local_2680;
  undefined4 uStack_267c;
  undefined4 uStack_2678;
  undefined4 uStack_2674;
  undefined4 uStack_2670;
  undefined4 uStack_266c;
  undefined4 uStack_2668;
  undefined4 uStack_2664;
  undefined8 local_2660;
  undefined8 uStack_2658;
  undefined8 uStack_2650;
  undefined8 uStack_2648;
  undefined1 local_2640 [32];
  undefined8 uStack_2610;
  ulong local_2608 [241];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  undefined1 auVar60 [32];
  undefined1 auVar68 [64];
  
  uVar45 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (uVar45 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar58 = vpcmpeqd_avx(in_ZMM3._0_16_,in_ZMM3._0_16_);
      auVar54 = vpcmpeqd_avx(auVar58,*(undefined1 (*) [16])(valid_i->field_0).field_1.vl);
      auVar25 = vpcmpeqd_avx(auVar58,*(undefined1 (*) [16])((long)&valid_i->field_0 + 0x10));
      auVar25 = vpackssdw_avx(auVar54,auVar25);
      auVar54 = vpacksswb_avx(auVar25,auVar25);
      bVar27 = SUB161(auVar54 >> 7,0) & 1 | (SUB161(auVar54 >> 0xf,0) & 1) << 1 |
               (SUB161(auVar54 >> 0x17,0) & 1) << 2 | (SUB161(auVar54 >> 0x1f,0) & 1) << 3 |
               (SUB161(auVar54 >> 0x27,0) & 1) << 4 | (SUB161(auVar54 >> 0x2f,0) & 1) << 5 |
               (SUB161(auVar54 >> 0x37,0) & 1) << 6 | SUB161(auVar54 >> 0x3f,0) << 7;
      if (bVar27 != 0) {
        uVar37 = (ulong)bVar27;
        auVar49 = *(undefined1 (*) [32])(ray + 0x80);
        auVar48._8_4_ = 0x7fffffff;
        auVar48._0_8_ = 0x7fffffff7fffffff;
        auVar48._12_4_ = 0x7fffffff;
        auVar48._16_4_ = 0x7fffffff;
        auVar48._20_4_ = 0x7fffffff;
        auVar48._24_4_ = 0x7fffffff;
        auVar48._28_4_ = 0x7fffffff;
        auVar55._8_4_ = 0x219392ef;
        auVar55._0_8_ = 0x219392ef219392ef;
        auVar55._12_4_ = 0x219392ef;
        auVar55._16_4_ = 0x219392ef;
        auVar55._20_4_ = 0x219392ef;
        auVar55._24_4_ = 0x219392ef;
        auVar55._28_4_ = 0x219392ef;
        auVar82 = vandps_avx(auVar49,auVar48);
        auVar82 = vcmpps_avx(auVar82,auVar55,1);
        auVar3 = vblendvps_avx(auVar49,auVar55,auVar82);
        local_2660 = *(undefined8 *)ray;
        uStack_2658 = *(undefined8 *)(ray + 8);
        uStack_2650 = *(undefined8 *)(ray + 0x10);
        uStack_2648 = *(undefined8 *)(ray + 0x18);
        auVar82 = *(undefined1 (*) [32])(ray + 0xa0);
        auVar69 = vandps_avx(auVar82,auVar48);
        auVar69 = vcmpps_avx(auVar69,auVar55,1);
        auVar73 = vblendvps_avx(auVar82,auVar55,auVar69);
        auVar69 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar48 = vandps_avx(auVar69,auVar48);
        auVar48 = vcmpps_avx(auVar48,auVar55,1);
        auVar56 = vrcpps_avx(auVar3);
        auVar48 = vblendvps_avx(auVar69,auVar55,auVar48);
        auVar79._8_4_ = 0x3f800000;
        auVar79._0_8_ = 0x3f8000003f800000;
        auVar79._12_4_ = 0x3f800000;
        auVar79._16_4_ = 0x3f800000;
        auVar79._20_4_ = 0x3f800000;
        auVar79._24_4_ = 0x3f800000;
        auVar79._28_4_ = 0x3f800000;
        uStack_2664 = *(undefined4 *)(ray + 0x3c);
        local_2680 = *(undefined4 *)(ray + 0x20);
        uStack_267c = *(undefined4 *)(ray + 0x24);
        uStack_2678 = *(undefined4 *)(ray + 0x28);
        uStack_2674 = *(undefined4 *)(ray + 0x2c);
        uStack_2670 = *(undefined4 *)(ray + 0x30);
        uStack_266c = *(undefined4 *)(ray + 0x34);
        uStack_2668 = *(undefined4 *)(ray + 0x38);
        auVar55 = vrcpps_avx(auVar73);
        fVar4 = auVar56._0_4_;
        fVar7 = auVar56._4_4_;
        auVar26._4_4_ = auVar3._4_4_ * fVar7;
        auVar26._0_4_ = auVar3._0_4_ * fVar4;
        fVar10 = auVar56._8_4_;
        auVar26._8_4_ = auVar3._8_4_ * fVar10;
        fVar13 = auVar56._12_4_;
        auVar26._12_4_ = auVar3._12_4_ * fVar13;
        fVar16 = auVar56._16_4_;
        auVar26._16_4_ = auVar3._16_4_ * fVar16;
        fVar19 = auVar56._20_4_;
        auVar26._20_4_ = auVar3._20_4_ * fVar19;
        fVar22 = auVar56._24_4_;
        auVar26._24_4_ = auVar3._24_4_ * fVar22;
        auVar26._28_4_ = uStack_2664;
        auVar26 = vsubps_avx(auVar79,auVar26);
        fVar5 = auVar55._0_4_;
        fVar8 = auVar55._4_4_;
        auVar3._4_4_ = auVar73._4_4_ * fVar8;
        auVar3._0_4_ = auVar73._0_4_ * fVar5;
        fVar11 = auVar55._8_4_;
        auVar3._8_4_ = auVar73._8_4_ * fVar11;
        fVar14 = auVar55._12_4_;
        auVar3._12_4_ = auVar73._12_4_ * fVar14;
        fVar17 = auVar55._16_4_;
        auVar3._16_4_ = auVar73._16_4_ * fVar17;
        fVar20 = auVar55._20_4_;
        auVar3._20_4_ = auVar73._20_4_ * fVar20;
        fVar23 = auVar55._24_4_;
        auVar3._24_4_ = auVar73._24_4_ * fVar23;
        auVar3._28_4_ = uStack_2664;
        auVar60 = vsubps_avx(auVar79,auVar3);
        auVar3 = vrcpps_avx(auVar48);
        fVar6 = auVar3._0_4_;
        fVar9 = auVar3._4_4_;
        auVar28._4_4_ = auVar48._4_4_ * fVar9;
        auVar28._0_4_ = auVar48._0_4_ * fVar6;
        fVar12 = auVar3._8_4_;
        auVar28._8_4_ = auVar48._8_4_ * fVar12;
        fVar15 = auVar3._12_4_;
        auVar28._12_4_ = auVar48._12_4_ * fVar15;
        fVar18 = auVar3._16_4_;
        auVar28._16_4_ = auVar48._16_4_ * fVar18;
        fVar21 = auVar3._20_4_;
        auVar28._20_4_ = auVar48._20_4_ * fVar21;
        fVar24 = auVar3._24_4_;
        auVar28._24_4_ = auVar48._24_4_ * fVar24;
        auVar28._28_4_ = auVar73._28_4_;
        auVar48 = vsubps_avx(auVar79,auVar28);
        auVar77._8_4_ = 1;
        auVar77._0_8_ = 0x100000001;
        auVar77._12_4_ = 1;
        auVar77._16_4_ = 1;
        auVar77._20_4_ = 1;
        auVar77._24_4_ = 1;
        auVar77._28_4_ = 1;
        auVar73 = ZEXT1232(ZEXT412(0)) << 0x20;
        auVar49 = vcmpps_avx(auVar49,auVar73,1);
        auVar49 = vandps_avx(auVar77,auVar49);
        auVar78._8_4_ = 2;
        auVar78._0_8_ = 0x200000002;
        auVar78._12_4_ = 2;
        auVar78._16_4_ = 2;
        auVar78._20_4_ = 2;
        auVar78._24_4_ = 2;
        auVar78._28_4_ = 2;
        auVar82 = vcmpps_avx(auVar82,auVar73,1);
        auVar82 = vandps_avx(auVar78,auVar82);
        local_26a0 = *(undefined8 *)(ray + 0x40);
        uStack_2698 = *(undefined8 *)(ray + 0x48);
        uStack_2690 = *(undefined8 *)(ray + 0x50);
        uStack_2688 = *(undefined8 *)(ray + 0x58);
        auVar82 = vorps_avx(auVar82,auVar49);
        auVar49 = vcmpps_avx(auVar69,ZEXT1232(ZEXT412(0)) << 0x20,1);
        auVar73._8_4_ = 4;
        auVar73._0_8_ = 0x400000004;
        auVar73._12_4_ = 4;
        auVar73._16_4_ = 4;
        auVar73._20_4_ = 4;
        auVar73._24_4_ = 4;
        auVar73._28_4_ = 4;
        auVar49 = vandps_avx(auVar49,auVar73);
        auVar82 = vorps_avx(auVar82,auVar49);
        auVar59 = vpmovsxwd_avx(auVar25);
        auVar25 = vpunpckhwd_avx(auVar25,auVar25);
        auVar67 = ZEXT1664(auVar25);
        auVar69._16_16_ = auVar25;
        auVar69._0_16_ = auVar59;
        auVar49 = vcmpps_avx(auVar73,auVar73,0xf);
        local_2720 = vblendvps_avx(auVar49,auVar82,auVar69);
        auVar54 = vblendvps_avx(auVar58,auVar82._16_16_,auVar25);
        do {
          lVar41 = 0;
          if (uVar37 != 0) {
            for (; (uVar37 >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
            }
          }
          uVar40 = *(undefined4 *)(local_2720 + lVar41 * 4);
          auVar81._4_4_ = uVar40;
          auVar81._0_4_ = uVar40;
          auVar81._8_4_ = uVar40;
          auVar81._12_4_ = uVar40;
          auVar58 = vpcmpeqd_avx(auVar81,auVar54);
          auVar81 = vpcmpeqd_avx(auVar81,local_2720._0_16_);
          auVar82._16_16_ = auVar58;
          auVar82._0_16_ = auVar3._0_16_;
          auVar82 = vblendps_avx(ZEXT1632(auVar81),auVar82,0xf0);
          uVar40 = vmovmskps_avx(auVar82);
          uVar37 = uVar37 & ~CONCAT44((int)((ulong)lVar41 >> 0x20),uVar40);
        } while (uVar37 != 0);
        auVar82 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),ZEXT832(0) << 0x20);
        local_2720 = vcmpps_avx(ZEXT1632(auVar54),ZEXT1632(auVar54),0xf);
        local_1e80._8_4_ = 0x7f800000;
        local_1e80._0_8_ = 0x7f8000007f800000;
        local_1e80._12_4_ = 0x7f800000;
        local_1e80._16_4_ = 0x7f800000;
        local_1e80._20_4_ = 0x7f800000;
        local_1e80._24_4_ = 0x7f800000;
        local_1e80._28_4_ = 0x7f800000;
        auVar80._16_16_ = auVar25;
        auVar80._0_16_ = auVar59;
        local_1e60 = vblendvps_avx(local_1e80,auVar82,auVar80);
        uStack_2610 = 0xfffffffffffffff8;
        local_2608[0] = uVar45;
        if (uVar45 != 0xfffffffffffffff8) {
          local_26c0 = fVar4 + auVar26._0_4_ * fVar4;
          fStack_26bc = fVar7 + auVar26._4_4_ * fVar7;
          fStack_26b8 = fVar10 + auVar26._8_4_ * fVar10;
          fStack_26b4 = fVar13 + auVar26._12_4_ * fVar13;
          fStack_26b0 = fVar16 + auVar26._16_4_ * fVar16;
          fStack_26ac = fVar19 + auVar26._20_4_ * fVar19;
          fStack_26a8 = fVar22 + auVar26._24_4_ * fVar22;
          fStack_26a4 = auVar56._28_4_ + auVar49._28_4_;
          local_26e0 = auVar60._0_4_ * fVar5 + fVar5;
          fStack_26dc = auVar60._4_4_ * fVar8 + fVar8;
          fStack_26d8 = auVar60._8_4_ * fVar11 + fVar11;
          fStack_26d4 = auVar60._12_4_ * fVar14 + fVar14;
          fStack_26d0 = auVar60._16_4_ * fVar17 + fVar17;
          fStack_26cc = auVar60._20_4_ * fVar20 + fVar20;
          fStack_26c8 = auVar60._24_4_ * fVar23 + fVar23;
          fStack_26c4 = auVar26._28_4_ + auVar55._28_4_;
          auVar54._8_4_ = 0x7f800000;
          auVar54._0_8_ = 0x7f8000007f800000;
          auVar54._12_4_ = 0x7f800000;
          local_2730 = vblendvps_avx(auVar54,auVar82._0_16_,auVar59);
          local_2740 = vblendvps_avx(auVar54,auVar82._16_16_,auVar25);
          auVar49 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT832(0) << 0x20);
          auVar56._16_16_ = auVar25;
          auVar56._0_16_ = auVar59;
          auVar58._8_4_ = 0xff800000;
          auVar58._0_8_ = 0xff800000ff800000;
          auVar58._12_4_ = 0xff800000;
          auVar60._16_4_ = 0xff800000;
          auVar60._0_16_ = auVar58;
          auVar60._20_4_ = 0xff800000;
          auVar60._24_4_ = 0xff800000;
          auVar60._28_4_ = 0xff800000;
          local_27e0 = vblendvps_avx(auVar60,auVar49,auVar56);
          local_2700 = fVar6 + auVar48._0_4_ * fVar6;
          fStack_26fc = fVar9 + auVar48._4_4_ * fVar9;
          fStack_26f8 = fVar12 + auVar48._8_4_ * fVar12;
          fStack_26f4 = fVar15 + auVar48._12_4_ * fVar15;
          fStack_26f0 = fVar18 + auVar48._16_4_ * fVar18;
          fStack_26ec = fVar21 + auVar48._20_4_ * fVar21;
          fStack_26e8 = fVar24 + auVar48._24_4_ * fVar24;
          fStack_26e4 = auVar3._28_4_ + auVar25._12_4_;
          local_27c0 = vblendvps_avx(auVar58,auVar49._16_16_,auVar25);
          puVar46 = local_2608;
          local_2800 = vblendvps_avx(auVar58,auVar49._0_16_,auVar59);
          pauVar47 = (undefined1 (*) [32])local_1e40;
          do {
            pauVar1 = pauVar47 + -1;
            auVar57 = ZEXT3264(*pauVar1);
            pauVar47 = pauVar47 + -1;
            auVar49 = vcmpps_avx(*pauVar1,local_27e0,1);
            if ((((((((auVar49 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar49 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar49 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar49 >> 0x7f,0) != '\0') ||
                  (auVar49 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar49 >> 0xbf,0) != '\0') ||
                (auVar49 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar49[0x1f] < '\0') {
              while ((uVar45 & 8) == 0) {
                lVar41 = 0;
                uVar38 = 0;
                auVar57 = ZEXT3264(CONCAT428(0x7f800000,
                                             CONCAT424(0x7f800000,
                                                       CONCAT420(0x7f800000,
                                                                 CONCAT416(0x7f800000,
                                                                           CONCAT412(0x7f800000,
                                                                                     CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                uVar37 = 8;
                do {
                  uVar43 = *(ulong *)((uVar45 & 0xfffffffffffffff0) + lVar41 * 8);
                  if (uVar43 == 8) break;
                  uVar40 = *(undefined4 *)(uVar45 + 0x20 + lVar41 * 4);
                  auVar61._4_4_ = uVar40;
                  auVar61._0_4_ = uVar40;
                  auVar61._8_4_ = uVar40;
                  auVar61._12_4_ = uVar40;
                  auVar61._16_4_ = uVar40;
                  auVar61._20_4_ = uVar40;
                  auVar61._24_4_ = uVar40;
                  auVar61._28_4_ = uVar40;
                  auVar36._8_8_ = uStack_2658;
                  auVar36._0_8_ = local_2660;
                  auVar36._16_8_ = uStack_2650;
                  auVar36._24_8_ = uStack_2648;
                  auVar49 = vsubps_avx(auVar61,auVar36);
                  auVar59._0_4_ = local_26c0 * auVar49._0_4_;
                  auVar59._4_4_ = fStack_26bc * auVar49._4_4_;
                  auVar59._8_4_ = fStack_26b8 * auVar49._8_4_;
                  auVar59._12_4_ = fStack_26b4 * auVar49._12_4_;
                  auVar29._16_4_ = fStack_26b0 * auVar49._16_4_;
                  auVar29._0_16_ = auVar59;
                  auVar29._20_4_ = fStack_26ac * auVar49._20_4_;
                  auVar29._24_4_ = fStack_26a8 * auVar49._24_4_;
                  auVar29._28_4_ = auVar49._28_4_;
                  uVar40 = *(undefined4 *)(uVar45 + 0x40 + lVar41 * 4);
                  auVar64._4_4_ = uVar40;
                  auVar64._0_4_ = uVar40;
                  auVar64._8_4_ = uVar40;
                  auVar64._12_4_ = uVar40;
                  auVar64._16_4_ = uVar40;
                  auVar64._20_4_ = uVar40;
                  auVar64._24_4_ = uVar40;
                  auVar64._28_4_ = uVar40;
                  auVar35._4_4_ = uStack_267c;
                  auVar35._0_4_ = local_2680;
                  auVar35._8_4_ = uStack_2678;
                  auVar35._12_4_ = uStack_2674;
                  auVar35._16_4_ = uStack_2670;
                  auVar35._20_4_ = uStack_266c;
                  auVar35._24_4_ = uStack_2668;
                  auVar35._28_4_ = uStack_2664;
                  auVar49 = vsubps_avx(auVar64,auVar35);
                  auVar66._0_4_ = local_26e0 * auVar49._0_4_;
                  auVar66._4_4_ = fStack_26dc * auVar49._4_4_;
                  auVar66._8_4_ = fStack_26d8 * auVar49._8_4_;
                  auVar66._12_4_ = fStack_26d4 * auVar49._12_4_;
                  auVar68._16_4_ = fStack_26d0 * auVar49._16_4_;
                  auVar68._0_16_ = auVar66;
                  auVar68._20_4_ = fStack_26cc * auVar49._20_4_;
                  auVar68._28_36_ = auVar67._28_36_;
                  auVar68._24_4_ = fStack_26c8 * auVar49._24_4_;
                  uVar40 = *(undefined4 *)(uVar45 + 0x60 + lVar41 * 4);
                  auVar65._4_4_ = uVar40;
                  auVar65._0_4_ = uVar40;
                  auVar65._8_4_ = uVar40;
                  auVar65._12_4_ = uVar40;
                  auVar65._16_4_ = uVar40;
                  auVar65._20_4_ = uVar40;
                  auVar65._24_4_ = uVar40;
                  auVar65._28_4_ = uVar40;
                  auVar34._8_8_ = uStack_2698;
                  auVar34._0_8_ = local_26a0;
                  auVar34._16_8_ = uStack_2690;
                  auVar34._24_8_ = uStack_2688;
                  auVar49 = vsubps_avx(auVar65,auVar34);
                  auVar63._0_4_ = local_2700 * auVar49._0_4_;
                  auVar63._4_4_ = fStack_26fc * auVar49._4_4_;
                  auVar63._8_4_ = fStack_26f8 * auVar49._8_4_;
                  auVar63._12_4_ = fStack_26f4 * auVar49._12_4_;
                  auVar30._16_4_ = fStack_26f0 * auVar49._16_4_;
                  auVar30._0_16_ = auVar63;
                  auVar30._20_4_ = fStack_26ec * auVar49._20_4_;
                  auVar30._24_4_ = fStack_26e8 * auVar49._24_4_;
                  auVar30._28_4_ = auVar49._28_4_;
                  uVar40 = *(undefined4 *)(uVar45 + 0x30 + lVar41 * 4);
                  auVar70._4_4_ = uVar40;
                  auVar70._0_4_ = uVar40;
                  auVar70._8_4_ = uVar40;
                  auVar70._12_4_ = uVar40;
                  auVar70._16_4_ = uVar40;
                  auVar70._20_4_ = uVar40;
                  auVar70._24_4_ = uVar40;
                  auVar70._28_4_ = uVar40;
                  auVar49 = vsubps_avx(auVar70,auVar36);
                  auVar74._0_4_ = local_26c0 * auVar49._0_4_;
                  auVar74._4_4_ = fStack_26bc * auVar49._4_4_;
                  auVar74._8_4_ = fStack_26b8 * auVar49._8_4_;
                  auVar74._12_4_ = fStack_26b4 * auVar49._12_4_;
                  auVar31._16_4_ = fStack_26b0 * auVar49._16_4_;
                  auVar31._0_16_ = auVar74;
                  auVar31._20_4_ = fStack_26ac * auVar49._20_4_;
                  auVar31._24_4_ = fStack_26a8 * auVar49._24_4_;
                  auVar31._28_4_ = fStack_26a4;
                  uVar40 = *(undefined4 *)(uVar45 + 0x50 + lVar41 * 4);
                  auVar71._4_4_ = uVar40;
                  auVar71._0_4_ = uVar40;
                  auVar71._8_4_ = uVar40;
                  auVar71._12_4_ = uVar40;
                  auVar71._16_4_ = uVar40;
                  auVar71._20_4_ = uVar40;
                  auVar71._24_4_ = uVar40;
                  auVar71._28_4_ = uVar40;
                  auVar49 = vsubps_avx(auVar71,auVar35);
                  auVar75._0_4_ = local_26e0 * auVar49._0_4_;
                  auVar75._4_4_ = fStack_26dc * auVar49._4_4_;
                  auVar75._8_4_ = fStack_26d8 * auVar49._8_4_;
                  auVar75._12_4_ = fStack_26d4 * auVar49._12_4_;
                  auVar32._16_4_ = fStack_26d0 * auVar49._16_4_;
                  auVar32._0_16_ = auVar75;
                  auVar32._20_4_ = fStack_26cc * auVar49._20_4_;
                  auVar32._24_4_ = fStack_26c8 * auVar49._24_4_;
                  auVar32._28_4_ = fStack_26c4;
                  uVar40 = *(undefined4 *)(uVar45 + 0x70 + lVar41 * 4);
                  auVar72._4_4_ = uVar40;
                  auVar72._0_4_ = uVar40;
                  auVar72._8_4_ = uVar40;
                  auVar72._12_4_ = uVar40;
                  auVar72._16_4_ = uVar40;
                  auVar72._20_4_ = uVar40;
                  auVar72._24_4_ = uVar40;
                  auVar72._28_4_ = uVar40;
                  auVar49 = vsubps_avx(auVar72,auVar34);
                  auVar76._0_4_ = local_2700 * auVar49._0_4_;
                  auVar76._4_4_ = fStack_26fc * auVar49._4_4_;
                  auVar76._8_4_ = fStack_26f8 * auVar49._8_4_;
                  auVar76._12_4_ = fStack_26f4 * auVar49._12_4_;
                  auVar33._16_4_ = fStack_26f0 * auVar49._16_4_;
                  auVar33._0_16_ = auVar76;
                  auVar33._20_4_ = fStack_26ec * auVar49._20_4_;
                  auVar33._24_4_ = fStack_26e8 * auVar49._24_4_;
                  auVar33._28_4_ = fStack_26e4;
                  auVar54 = vpminsd_avx(auVar59,auVar74);
                  auVar25 = vpminsd_avx(auVar29._16_16_,auVar31._16_16_);
                  auVar58 = vpminsd_avx(auVar66,auVar75);
                  auVar54 = vpmaxsd_avx(auVar54,auVar58);
                  auVar58 = vpminsd_avx(auVar68._16_16_,auVar32._16_16_);
                  auVar25 = vpmaxsd_avx(auVar25,auVar58);
                  auVar58 = vpminsd_avx(auVar63,auVar76);
                  auVar54 = vpmaxsd_avx(auVar54,auVar58);
                  auVar58 = vpminsd_avx(auVar30._16_16_,auVar33._16_16_);
                  auVar25 = vpmaxsd_avx(auVar25,auVar58);
                  auVar58 = vpmaxsd_avx(auVar59,auVar74);
                  auVar59 = vpmaxsd_avx(auVar29._16_16_,auVar31._16_16_);
                  auVar81 = vpmaxsd_avx(auVar66,auVar75);
                  auVar81 = vpminsd_avx(auVar58,auVar81);
                  auVar58 = vpmaxsd_avx(auVar68._16_16_,auVar32._16_16_);
                  auVar67 = ZEXT1664(auVar58);
                  auVar59 = vpminsd_avx(auVar59,auVar58);
                  auVar58 = vpmaxsd_avx(auVar63,auVar76);
                  auVar58 = vpminsd_avx(auVar58,local_2800);
                  auVar81 = vpminsd_avx(auVar81,auVar58);
                  auVar58 = vpmaxsd_avx(auVar30._16_16_,auVar33._16_16_);
                  auVar58 = vpminsd_avx(auVar58,local_27c0);
                  auVar63 = vpminsd_avx(auVar59,auVar58);
                  auVar58 = vpmaxsd_avx(auVar54,local_2730);
                  auVar59 = vpmaxsd_avx(auVar25,local_2740);
                  auVar62._16_16_ = auVar59;
                  auVar62._0_16_ = auVar58;
                  auVar49._16_16_ = auVar63;
                  auVar49._0_16_ = auVar81;
                  auVar49 = vcmpps_avx(auVar62,auVar49,2);
                  if ((((((((auVar49 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar49 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar49 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar49 >> 0x7f,0) != '\0') ||
                        (auVar49 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar49 >> 0xbf,0) != '\0') ||
                      (auVar49 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar49[0x1f] < '\0') {
                    auVar50._16_16_ = auVar25;
                    auVar50._0_16_ = auVar54;
                    auVar52._8_4_ = 0x7f800000;
                    auVar52._0_8_ = 0x7f8000007f800000;
                    auVar52._12_4_ = 0x7f800000;
                    auVar52._16_4_ = 0x7f800000;
                    auVar52._20_4_ = 0x7f800000;
                    auVar52._24_4_ = 0x7f800000;
                    auVar52._28_4_ = 0x7f800000;
                    auVar49 = vblendvps_avx(auVar52,auVar50,auVar49);
                    auVar48 = auVar57._0_32_;
                    auVar82 = vcmpps_avx(auVar49,auVar48,1);
                    uVar42 = uVar37;
                    uVar44 = uVar43;
                    auVar69 = auVar49;
                    if (((((((((auVar82 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                              (auVar82 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                             (auVar82 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            SUB321(auVar82 >> 0x7f,0) == '\0') &&
                           (auVar82 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          SUB321(auVar82 >> 0xbf,0) == '\0') &&
                         (auVar82 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         -1 < auVar82[0x1f]) ||
                       (uVar42 = uVar43, uVar44 = uVar37, auVar69 = auVar48, auVar48 = auVar49,
                       uVar37 != 8)) {
                      auVar49 = auVar48;
                      uVar38 = uVar38 + 1;
                      *puVar46 = uVar44;
                      puVar46 = puVar46 + 1;
                      *pauVar47 = auVar69;
                      pauVar47 = pauVar47 + 1;
                      uVar43 = uVar42;
                    }
                    auVar57 = ZEXT3264(auVar49);
                    uVar37 = uVar43;
                  }
                  lVar41 = lVar41 + 1;
                } while (lVar41 != 4);
                if (uVar37 == 8) {
                  uVar45 = puVar46[-1];
                  goto LAB_00370256;
                }
                uVar45 = uVar37;
                if (1 < uVar38) {
                  auVar49 = pauVar47[-2];
                  auVar82 = pauVar47[-1];
                  auVar67 = ZEXT3264(auVar82);
                  auVar48 = vcmpps_avx(auVar49,auVar82,1);
                  auVar69 = auVar82;
                  if ((((((((auVar48 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar48 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar48 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar48 >> 0x7f,0) != '\0') ||
                        (auVar48 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar48 >> 0xbf,0) != '\0') ||
                      (auVar48 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar48[0x1f] < '\0') {
                    pauVar47[-2] = auVar82;
                    pauVar47[-1] = auVar49;
                    auVar54 = vpermilps_avx(*(undefined1 (*) [16])(puVar46 + -2),0x4e);
                    *(undefined1 (*) [16])(puVar46 + -2) = auVar54;
                    auVar69 = auVar49;
                    auVar49 = auVar82;
                  }
                  if (uVar38 != 2) {
                    auVar82 = pauVar47[-3];
                    auVar67 = ZEXT3264(auVar82);
                    auVar48 = vcmpps_avx(auVar82,auVar69,1);
                    if ((((((((auVar48 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar48 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar48 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar48 >> 0x7f,0) != '\0') ||
                          (auVar48 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar48 >> 0xbf,0) != '\0') ||
                        (auVar48 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar48[0x1f] < '\0') {
                      pauVar47[-3] = auVar69;
                      pauVar47[-1] = auVar82;
                      uVar37 = puVar46[-3];
                      puVar46[-3] = puVar46[-1];
                      puVar46[-1] = uVar37;
                      auVar82 = auVar69;
                    }
                    auVar69 = vcmpps_avx(auVar82,auVar49,1);
                    if ((((((((auVar69 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar69 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar69 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar69 >> 0x7f,0) != '\0') ||
                          (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar69 >> 0xbf,0) != '\0') ||
                        (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar69[0x1f] < '\0') {
                      pauVar47[-3] = auVar49;
                      pauVar47[-2] = auVar82;
                      auVar54 = vpermilps_avx(*(undefined1 (*) [16])(puVar46 + -3),0x4e);
                      *(undefined1 (*) [16])(puVar46 + -3) = auVar54;
                    }
                  }
                }
              }
              if (uVar45 == 0xfffffffffffffff8) {
                return;
              }
              auVar49 = vcmpps_avx(local_27e0,auVar57._0_32_,6);
              if ((((((((auVar49 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar49 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar49 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar49 >> 0x7f,0) != '\0') ||
                    (auVar49 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar49 >> 0xbf,0) != '\0') ||
                  (auVar49 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar49[0x1f] < '\0') {
                uVar37 = (ulong)((uint)uVar45 & 0xf);
                if (uVar37 != 8) {
                  lVar41 = 0;
                  do {
                    local_2788.geomID = *(uint *)((uVar45 & 0xfffffffffffffff0) + lVar41 * 8);
                    local_2758 = (context->scene->geometries).items[local_2788.geomID].ptr;
                    uVar2 = local_2758->mask;
                    auVar51._4_4_ = uVar2;
                    auVar51._0_4_ = uVar2;
                    auVar51._8_4_ = uVar2;
                    auVar51._12_4_ = uVar2;
                    auVar51._16_4_ = uVar2;
                    auVar51._20_4_ = uVar2;
                    auVar51._24_4_ = uVar2;
                    auVar51._28_4_ = uVar2;
                    auVar82 = vandps_avx(auVar51,*(undefined1 (*) [32])(ray + 0x120));
                    auVar54 = vpcmpeqd_avx(auVar82._16_16_,ZEXT816(0) << 0x40);
                    auVar25 = vpcmpeqd_avx(auVar82._0_16_,ZEXT816(0) << 0x40);
                    auVar53._16_16_ = auVar54;
                    auVar53._0_16_ = auVar25;
                    auVar82 = vblendps_avx(ZEXT1632(auVar25),auVar53,0xf0);
                    auVar69 = auVar49 & ~auVar82;
                    if ((((((((auVar69 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar69 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar69 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar69 >> 0x7f,0) != '\0') ||
                          (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar69 >> 0xbf,0) != '\0') ||
                        (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar69[0x1f] < '\0') {
                      local_2640 = vandnps_avx(auVar82,auVar49);
                      local_2788.primID = *(uint *)((uVar45 & 0xfffffffffffffff0) + 4 + lVar41 * 8);
                      local_2788.valid = (int *)local_2640;
                      local_2788.geometryUserPtr = local_2758->userPtr;
                      local_2788.context = context->user;
                      local_2788.N = 8;
                      local_2750 = 0;
                      local_2748 = context->args;
                      pp_Var39 = (_func_int **)local_2748->intersect;
                      if (pp_Var39 == (_func_int **)0x0) {
                        pp_Var39 = local_2758[1].super_RefCount._vptr_RefCount;
                      }
                      auVar67 = ZEXT1664(auVar67._0_16_);
                      local_2788.rayhit = (RTCRayHitN *)ray;
                      (*(code *)pp_Var39)(&local_2788);
                    }
                    lVar41 = lVar41 + 1;
                  } while (uVar37 - 8 != lVar41);
                }
                local_27e0 = vblendvps_avx(local_27e0,*(undefined1 (*) [32])(ray + 0x100),auVar49);
              }
            }
            local_2800 = local_27e0._0_16_;
            local_27c0 = local_27e0._16_16_;
            uVar45 = puVar46[-1];
LAB_00370256:
            puVar46 = puVar46 + -1;
          } while (uVar45 != 0xfffffffffffffff8);
        }
      }
    }
    else {
      intersectCoherent(valid_i,This,ray,context);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }